

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::to_string_function::evaluate
          (to_string_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *this_00;
  unsigned_long *puVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  reference arg0;
  string *in_stack_ffffffffffffff28;
  assertion_error *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  jmespath_errc __e;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  reference local_8;
  
  __e = (jmespath_errc)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  this_00 = (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *)std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ::size(in_RSI);
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::arity((function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *)in_RDI);
  puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x528bec);
  if (this_00 ==
      (eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
       *)*puVar2) {
    pvVar4 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,0);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            ::is_value(pvVar4);
    if (bVar1) {
      pvVar4 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               ::operator[](in_RSI,0);
      parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ::value(pvVar4);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 &stack0xffffffffffffff68);
      local_8 = eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                ::create_json<std::__cxx11::string>(this_00,in_RDI);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    }
    else {
      std::error_code::operator=((error_code *)in_stack_ffffffffffffff40,__e);
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::null_value(in_stack_ffffffffffffff40);
    }
    return local_8;
  }
  uVar3 = __cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,(allocator<char> *)this_00)
  ;
  assertion_error::assertion_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  __cxa_throw(uVar3,&assertion_error::typeinfo,assertion_error::~assertion_error);
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                return *context.create_json(arg0.template as<string_type>());
            }